

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StringAggBind
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  pointer pEVar3;
  ulong uVar4;
  ParameterNotResolvedException *this;
  BinderException *this_00;
  type pEVar5;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  SimpleFunction *in_RDX;
  Expression *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  string separator_string;
  Value separator_val;
  unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>_>
  *in_stack_fffffffffffffe48;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_fffffffffffffe50;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> args;
  char (*in_stack_fffffffffffffea8) [2];
  string local_150 [8];
  Value *in_stack_fffffffffffffeb8;
  LogicalType local_130 [24];
  Value local_118 [87];
  allocator local_c1;
  string local_c0 [32];
  ClientContext local_a0 [70];
  undefined1 local_5a;
  allocator local_59;
  string local_58 [56];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *local_20;
  SimpleFunction *local_18;
  Expression *local_10;
  
  args._M_head_impl =
       (FunctionData *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar2 = std::
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
          ::size(in_RCX);
  if (sVar2 == 1) {
    make_uniq<duckdb::StringAggBindData,char_const(&)[2]>(in_stack_fffffffffffffea8);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<duckdb::StringAggBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffffe50,
               (unique_ptr<duckdb::StringAggBindData,_std::default_delete<duckdb::StringAggBindData>_>
                *)in_stack_fffffffffffffe48);
    unique_ptr<duckdb::StringAggBindData,_std::default_delete<duckdb::StringAggBindData>,_true>::
    ~unique_ptr((unique_ptr<duckdb::StringAggBindData,_std::default_delete<duckdb::StringAggBindData>,_true>
                 *)0x826f8a);
  }
  else {
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[](in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe50);
    uVar4 = (**(code **)(*(long *)pEVar3 + 0x30))();
    if ((uVar4 & 1) != 0) {
      this = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
      duckdb::ParameterNotResolvedException::ParameterNotResolvedException(this);
      __cxa_throw(this,&ParameterNotResolvedException::typeinfo,
                  ParameterNotResolvedException::~ParameterNotResolvedException);
    }
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[](in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffffe50);
    uVar4 = (**(code **)(*(long *)pEVar3 + 0x78))();
    if ((uVar4 & 1) == 0) {
      local_5a = 1;
      this_00 = (BinderException *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_58,"Separator argument to StringAgg must be a constant",&local_59);
      duckdb::BinderException::BinderException(this_00,local_58);
      local_5a = 0;
      __cxa_throw(this_00,&BinderException::typeinfo,BinderException::~BinderException);
    }
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
    ::operator[](in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
    pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffffe50);
    duckdb::ExpressionExecutor::EvaluateScalar(local_a0,local_10,SUB81(pEVar5,0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,",",&local_c1);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    bVar1 = Value::IsNull((Value *)local_a0);
    if (bVar1) {
      duckdb::LogicalType::LogicalType(local_130,VARCHAR);
      duckdb::Value::Value(local_118,local_130);
      make_uniq<duckdb::BoundConstantExpression,duckdb::Value>(in_stack_fffffffffffffeb8);
      unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
      unique_ptr<duckdb::BoundConstantExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::operator[](in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe50,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffe48);
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 0x82723c);
      unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
      ::~unique_ptr((unique_ptr<duckdb::BoundConstantExpression,_std::default_delete<duckdb::BoundConstantExpression>,_true>
                     *)0x827249);
      duckdb::Value::~Value(local_118);
      duckdb::LogicalType::~LogicalType(local_130);
    }
    else {
      duckdb::Value::ToString_abi_cxx11_();
      std::__cxx11::string::operator=(local_c0,local_150);
      std::__cxx11::string::~string(local_150);
    }
    sVar2 = std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::size(local_20);
    duckdb::Function::EraseArgument(local_18,(vector *)local_20,sVar2 - 1);
    make_uniq<duckdb::StringAggBindData,std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               args._M_head_impl);
    unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
    unique_ptr<duckdb::StringAggBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               local_18,(unique_ptr<duckdb::StringAggBindData,_std::default_delete<duckdb::StringAggBindData>_>
                         *)in_stack_fffffffffffffe48);
    unique_ptr<duckdb::StringAggBindData,_std::default_delete<duckdb::StringAggBindData>,_true>::
    ~unique_ptr((unique_ptr<duckdb::StringAggBindData,_std::default_delete<duckdb::StringAggBindData>,_true>
                 *)0x8273b3);
    std::__cxx11::string::~string(local_c0);
    duckdb::Value::~Value((Value *)local_a0);
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> StringAggBind(ClientContext &context, AggregateFunction &function,
                                       vector<unique_ptr<Expression>> &arguments) {
	if (arguments.size() == 1) {
		// single argument: default to comma
		return make_uniq<StringAggBindData>(",");
	}
	D_ASSERT(arguments.size() == 2);
	if (arguments[1]->HasParameter()) {
		throw ParameterNotResolvedException();
	}
	if (!arguments[1]->IsFoldable()) {
		throw BinderException("Separator argument to StringAgg must be a constant");
	}
	auto separator_val = ExpressionExecutor::EvaluateScalar(context, *arguments[1]);
	string separator_string = ",";
	if (separator_val.IsNull()) {
		arguments[0] = make_uniq<BoundConstantExpression>(Value(LogicalType::VARCHAR));
	} else {
		separator_string = separator_val.ToString();
	}
	Function::EraseArgument(function, arguments, arguments.size() - 1);
	return make_uniq<StringAggBindData>(std::move(separator_string));
}